

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double __thiscall ON_SurfaceCurvature::GaussianCurvature(ON_SurfaceCurvature *this)

{
  double local_20;
  ON_SurfaceCurvature *this_local;
  
  if ((((this->k1 <= -1.23432101234321e+308) ||
       (1.23432101234321e+308 < this->k1 || this->k1 == 1.23432101234321e+308)) ||
      (this->k2 <= -1.23432101234321e+308)) ||
     (1.23432101234321e+308 < this->k2 || this->k2 == 1.23432101234321e+308)) {
    local_20 = ON_DBL_QNAN;
  }
  else {
    local_20 = this->k1 * this->k2;
  }
  return local_20;
}

Assistant:

double ON_SurfaceCurvature::GaussianCurvature() const
{
  return (ON_IS_VALID(k1) && ON_IS_VALID(k2)) ? (k1 * k2) : ON_DBL_QNAN;
}